

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTreeWalkerImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMTreeWalkerImpl::getFirstChild(DOMTreeWalkerImpl *this,DOMNode *node)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMNode *pDVar3;
  
  while( true ) {
    if ((node == (DOMNode *)0x0) ||
       ((this->fExpandEntityReferences == false &&
        (iVar2 = (*node->_vptr_DOMNode[4])(node), iVar2 == 5)))) {
      return (DOMNode *)0x0;
    }
    iVar2 = (*node->_vptr_DOMNode[7])(node);
    node = (DOMNode *)CONCAT44(extraout_var,iVar2);
    if (node == (DOMNode *)0x0) {
      return (DOMNode *)0x0;
    }
    sVar1 = acceptNode(this,node);
    if (sVar1 != 3) break;
    iVar2 = (*node->_vptr_DOMNode[0x12])(node);
    if ((char)iVar2 == '\0') {
LAB_00286d05:
      pDVar3 = getNextSibling(this,node);
      return pDVar3;
    }
  }
  if (sVar1 == 1) {
    return node;
  }
  goto LAB_00286d05;
}

Assistant:

DOMNode* DOMTreeWalkerImpl::getFirstChild (DOMNode* node) {

    if (!node) return 0;

    if(!fExpandEntityReferences && node->getNodeType()==DOMNode::ENTITY_REFERENCE_NODE)
        return 0;

    DOMNode* newNode = node->getFirstChild();
    if (!newNode)  return 0;

    short accept = acceptNode(newNode);

    if (accept == DOMNodeFilter::FILTER_ACCEPT)
        return newNode;
    else
    if (accept == DOMNodeFilter::FILTER_SKIP
        && newNode->hasChildNodes())
    {
        return getFirstChild(newNode);
    }
    return getNextSibling(newNode);

}